

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::AccessorEnumFieldGenerator::AccessorEnumFieldGenerator
          (AccessorEnumFieldGenerator *this,FieldDescriptor *descriptor,Params *params,
          int has_bit_index)

{
  _Rb_tree_header *p_Var1;
  EnumDescriptor *enum_descriptor;
  string local_50;
  
  (this->super_FieldGenerator).params_ = params;
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__AccessorEnumFieldGenerator_0042aad0;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->canonical_values_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_3::SetEnumVariables(params,descriptor,&this->variables_);
  enum_descriptor = FieldDescriptor::enum_type(descriptor);
  anon_unknown_3::LoadEnumValues(params,enum_descriptor,&this->canonical_values_);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"has","");
  SetBitOperationVariables(&local_50,has_bit_index,&this->variables_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AccessorEnumFieldGenerator::
AccessorEnumFieldGenerator(const FieldDescriptor* descriptor,
    const Params& params, int has_bit_index)
  : FieldGenerator(params), descriptor_(descriptor) {
  SetEnumVariables(params, descriptor, &variables_);
  LoadEnumValues(params, descriptor->enum_type(), &canonical_values_);
  SetBitOperationVariables("has", has_bit_index, &variables_);
}